

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

void sys_expandpath(char *from,char *to,int bufsize)

{
  int iVar1;
  size_t sVar2;
  char *__src;
  size_t sVar3;
  char *home;
  int bufsize_local;
  char *to_local;
  char *from_local;
  
  sVar2 = strlen(from);
  if (((sVar2 == 1) && (*from == '~')) || (iVar1 = strncmp(from,"~/",2), iVar1 == 0)) {
    __src = getenv("HOME");
    if (__src == (char *)0x0) {
      *to = '\0';
    }
    else {
      strncpy(to,__src,(long)bufsize);
      to[bufsize + -1] = '\0';
      sVar2 = strlen(to);
      sVar3 = strlen(to);
      strncpy(to + sVar2,from + 1,(long)bufsize - sVar3);
      to[bufsize + -1] = '\0';
    }
  }
  else {
    strncpy(to,from,(long)bufsize);
    to[bufsize + -1] = '\0';
  }
  return;
}

Assistant:

static void sys_expandpath(const char *from, char *to, int bufsize)
{
    if ((strlen(from) == 1 && from[0] == '~') || (strncmp(from,"~/", 2) == 0))
    {
#ifdef _WIN32
        const char *home = getenv("USERPROFILE");
#else
        const char *home = getenv("HOME");
#endif
        if (home)
        {
            strncpy(to, home, bufsize);
            to[bufsize-1] = 0;
            strncpy(to + strlen(to), from + 1, bufsize - strlen(to));
            to[bufsize-1] = 0;
        }
        else *to = 0;
    }
    else
    {
        strncpy(to, from, bufsize);
        to[bufsize-1] = 0;
    }
#ifdef _WIN32
    {
        char *buf = alloca(bufsize);
        ExpandEnvironmentStrings(to, buf, bufsize-1);
        buf[bufsize-1] = 0;
        strncpy(to, buf, bufsize);
        to[bufsize-1] = 0;
    }
#endif
}